

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

string * __thiscall
Catch::ReporterFactory<Catch::CompactReporter>::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,ReporterFactory<Catch::CompactReporter> *this)

{
  CompactReporter::getDescription_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

std::string getDescription() const override {
            return T::getDescription();
        }